

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

QRect __thiscall QPicture::boundingRect(QPicture *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  QPicturePrivate *this_00;
  undefined4 uVar7;
  undefined4 uVar8;
  QRect *pQVar9;
  undefined4 in_EAX;
  int iVar10;
  QRect *pQVar11;
  undefined1 auVar12 [16];
  QRect QVar13;
  
  this_00 = (this->d_ptr).d.ptr;
  uVar1 = (this_00->override_rect).x1;
  uVar3 = (this_00->override_rect).y1;
  uVar2 = (this_00->override_rect).x2;
  uVar4 = (this_00->override_rect).y2;
  auVar12._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
  auVar12._4_4_ = auVar12._0_4_;
  auVar12._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
  auVar12._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
  iVar10 = movmskpd(in_EAX,auVar12);
  if (iVar10 == 0) {
    pQVar11 = &this_00->override_rect;
    pQVar9 = &this_00->override_rect;
  }
  else {
    if (this_00->formatOk == false) {
      QPicturePrivate::checkFormat(this_00);
    }
    pQVar11 = &this_00->brect;
    pQVar9 = &this_00->brect;
  }
  uVar5 = pQVar9->x2;
  uVar7 = pQVar9->y2;
  QVar13.y2.m_i = uVar7;
  QVar13.x2.m_i = uVar5;
  uVar6 = pQVar11->x1;
  uVar8 = pQVar11->y1;
  QVar13.y1.m_i = uVar8;
  QVar13.x1.m_i = uVar6;
  return QVar13;
}

Assistant:

constexpr P get() const noexcept { return ptr; }